

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
kj::_::
Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++:213:3)>
::~Deferred(Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_disk_test_c__:213:3)>
            *this)

{
  char (*__name) [35];
  int iVar1;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (this->canceled == false) {
    __name = (this->func).filename;
    do {
      iVar1 = unlink(*__name);
      if (-1 < iVar1) {
        iVar1 = 0;
        break;
      }
      iVar1 = Debug::getOsErrorNumber(false);
    } while (iVar1 == -1);
    if (iVar1 != 0) {
      local_30.exception = (Exception *)0x0;
      local_28 = 0;
      uStack_20 = 0;
      Debug::Fault::init(&local_30,
                         (EVP_PKEY_CTX *)
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
                        );
      Debug::Fault::fatal(&local_30);
    }
  }
  return;
}

Assistant:

inline ~Deferred() noexcept(false) { if (!canceled) func(); }